

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O1

String * __thiscall
kj::anon_unknown_0::percentDecode
          (String *__return_storage_ptr__,anon_unknown_0 *this,ArrayPtr<const_char> text,
          bool *hadErrors,Options *options)

{
  uchar *puVar1;
  size_t sVar2;
  String *result;
  char *__dest;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  uchar *puVar5;
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::Array<unsigned_char>_> local_58;
  
  text_00.ptr = text.ptr;
  if (*hadErrors == true) {
    text_00.size_ = 1;
    decodeBinaryUriComponent(&local_58,(kj *)this,text_00,SUB82(hadErrors,0));
    sVar3 = local_58.super_Array<unsigned_char>.size_;
    puVar5 = local_58.super_Array<unsigned_char>.ptr;
    if (local_58.super_Array<unsigned_char>.disposer == (ArrayDisposer *)0x0) {
      puVar5 = (uchar *)0x0;
      sVar3 = 0;
      pAVar4 = (ArrayDisposer *)0x0;
    }
    else {
      local_58.super_Array<unsigned_char>.ptr = (uchar *)0x0;
      local_58.super_Array<unsigned_char>.size_ = 0;
      pAVar4 = local_58.super_Array<unsigned_char>.disposer;
    }
    sVar2 = local_58.super_Array<unsigned_char>.size_;
    puVar1 = local_58.super_Array<unsigned_char>.ptr;
    if (local_58.super_Array<unsigned_char>.ptr != (uchar *)0x0) {
      local_58.super_Array<unsigned_char>.ptr = (uchar *)0x0;
      local_58.super_Array<unsigned_char>.size_ = 0;
      (**(local_58.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
                (local_58.super_Array<unsigned_char>.disposer,puVar1,1,sVar2,sVar2,0);
    }
    if (local_58.hadErrors != false) {
      *(undefined1 *)text.size_ = 1;
    }
    (__return_storage_ptr__->content).ptr = (char *)puVar5;
    (__return_storage_ptr__->content).size_ = sVar3;
    (__return_storage_ptr__->content).disposer = pAVar4;
  }
  else {
    heapString(__return_storage_ptr__,(size_t)text_00.ptr);
    if (text_00.ptr != (char *)0x0) {
      __dest = (char *)(__return_storage_ptr__->content).size_;
      if (__dest != (char *)0x0) {
        __dest = (__return_storage_ptr__->content).ptr;
      }
      memcpy(__dest,this,(size_t)text_00.ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String percentDecode(ArrayPtr<const char> text, bool& hadErrors, const Url::Options& options) {
  if (options.percentDecode) {
    auto result = decodeUriComponent(text);
    if (result.hadErrors) hadErrors = true;
    return kj::mv(result);
  }
  return kj::str(text);
}